

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_tls12_phash(ptls_hash_algorithm_t *algo,void *output,size_t outlen,ptls_iovec_t secret,
                    char *label,ptls_iovec_t seed)

{
  _func_void_st_ptls_hash_context_t_ptr_void_ptr_size_t *p_Var1;
  ptls_hash_context_t *ppVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  uint8_t An [64];
  undefined1 local_78 [72];
  
  ppVar2 = ptls_hmac_create(algo,secret.base,secret.len);
  if (ppVar2 == (ptls_hash_context_t *)0x0) {
    iVar4 = 0x201;
  }
  else {
    if (label != (char *)0x0) {
      p_Var1 = ppVar2->update;
      sVar3 = strlen(label);
      (*p_Var1)(ppVar2,label,sVar3);
    }
    (*ppVar2->update)(ppVar2,seed.base,seed.len);
    (*ppVar2->final)(ppVar2,local_78,PTLS_HASH_FINAL_MODE_RESET);
    lVar5 = 0;
    while( true ) {
      (*ppVar2->update)(ppVar2,local_78,algo->digest_size);
      if (label != (char *)0x0) {
        p_Var1 = ppVar2->update;
        sVar3 = strlen(label);
        (*p_Var1)(ppVar2,label,sVar3);
      }
      (*ppVar2->update)(ppVar2,seed.base,seed.len);
      if (outlen - lVar5 <= algo->digest_size) break;
      (*ppVar2->final)(ppVar2,(void *)((long)output + lVar5),PTLS_HASH_FINAL_MODE_RESET);
      lVar5 = lVar5 + algo->digest_size;
      (*ppVar2->update)(ppVar2,local_78,algo->digest_size);
      (*ppVar2->final)(ppVar2,local_78,PTLS_HASH_FINAL_MODE_RESET);
    }
    iVar4 = 0;
    (*ppVar2->final)(ppVar2,local_78,PTLS_HASH_FINAL_MODE_FREE);
    memcpy((void *)((long)output + lVar5),local_78,outlen - lVar5);
    (*ptls_clear_memory)(local_78,algo->digest_size);
  }
  return iVar4;
}

Assistant:

int ptls_tls12_phash(ptls_hash_algorithm_t *algo, void *output, size_t outlen, ptls_iovec_t secret, const char *label,
                     ptls_iovec_t seed)
{
    ptls_hash_context_t *hmac;
    uint8_t An[PTLS_MAX_DIGEST_SIZE];
    size_t output_off = 0;

    if ((hmac = ptls_hmac_create(algo, secret.base, secret.len)) == NULL)
        return PTLS_ERROR_NO_MEMORY;

    /* A(1) = HMAC_hash(secret, label + seed) */
    if (label != NULL)
        hmac->update(hmac, label, strlen(label));
    hmac->update(hmac, seed.base, seed.len);
    hmac->final(hmac, An, PTLS_HASH_FINAL_MODE_RESET);

    while (1) {
        /* output += HMAC_hash(secret, A(i) + label + seed) */
        hmac->update(hmac, An, algo->digest_size);
        if (label != NULL)
            hmac->update(hmac, label, strlen(label));
        hmac->update(hmac, seed.base, seed.len);
        if (outlen - output_off <= algo->digest_size) {
            /* digest of last chunk is at first written to An then the necessary bytes are copied to output */
            hmac->final(hmac, An, PTLS_HASH_FINAL_MODE_FREE);
            memcpy((uint8_t *)output + output_off, An, outlen - output_off);
            break;
        }
        hmac->final(hmac, (uint8_t *)output + output_off, PTLS_HASH_FINAL_MODE_RESET);
        output_off += algo->digest_size;

        /* A(i) = HMAC_hash(secret, A(i-1)) */
        hmac->update(hmac, An, algo->digest_size);
        hmac->final(hmac, An, PTLS_HASH_FINAL_MODE_RESET);
    }

    ptls_clear_memory(An, algo->digest_size);

    return 0;
}